

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::InsertShiftedInfo
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t indent_length,GeneratedCodeInfo *target_info)

{
  bool bVar1;
  int32_t iVar2;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *this_00;
  reference this_01;
  GeneratedCodeInfo_Annotation *this_02;
  long lVar3;
  char *pcVar4;
  int local_64;
  int inner_indent;
  Annotation *annotation;
  GeneratedCodeInfo_Annotation *source_annotation;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *__range2;
  size_t pos;
  GeneratedCodeInfo *target_info_local;
  size_t indent_length_local;
  size_t insertion_offset_local;
  string *insertion_content_local;
  MemoryOutputStream *this_local;
  
  __range2 = (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)0x0;
  indent_length_local = indent_length + insertion_offset;
  this_00 = GeneratedCodeInfo::annotation(&this->info_to_insert_);
  __end2 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::begin(this_00);
  source_annotation =
       (GeneratedCodeInfo_Annotation *)
       RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::end(this_00);
  while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>
                 ::operator!=(&__end2,(iterator *)&source_annotation), bVar1) {
    this_01 = internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::
              operator*(&__end2);
    this_02 = GeneratedCodeInfo::add_annotation(target_info);
    local_64 = 0;
    while( true ) {
      iVar2 = GeneratedCodeInfo_Annotation::end(this_01);
      bVar1 = false;
      if (__range2 < (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)(long)iVar2
         ) {
        lVar3 = std::__cxx11::string::size();
        bVar1 = __range2 <
                (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)(lVar3 - 1U);
      }
      if (!bVar1) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)insertion_content);
      if (*pcVar4 == '\n') {
        iVar2 = GeneratedCodeInfo_Annotation::begin(this_01);
        if (__range2 <
            (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)(long)iVar2) {
          indent_length_local = indent_length + indent_length_local;
        }
        else {
          local_64 = local_64 + (int)indent_length;
        }
      }
      __range2 = (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
                 ((long)&(__range2->super_RepeatedPtrFieldBase).arena_ + 1);
    }
    GeneratedCodeInfo_Annotation::operator=(this_02,this_01);
    iVar2 = GeneratedCodeInfo_Annotation::begin(this_02);
    GeneratedCodeInfo_Annotation::set_begin(this_02,iVar2 + (int)indent_length_local);
    indent_length_local = (long)local_64 + indent_length_local;
    iVar2 = GeneratedCodeInfo_Annotation::end(this_02);
    GeneratedCodeInfo_Annotation::set_end(this_02,iVar2 + (int)indent_length_local);
    internal::RepeatedPtrIterator<const_google::protobuf::GeneratedCodeInfo_Annotation>::operator++
              (&__end2);
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::InsertShiftedInfo(
    const std::string& insertion_content, size_t insertion_offset,
    size_t indent_length, google::protobuf::GeneratedCodeInfo& target_info) {
  // Keep track of how much extra data was added for indents before the
  // current annotation being inserted. `pos` and `source_annotation.begin()`
  // are offsets in `insertion_content`. `insertion_offset` is updated so that
  // it can be added to an annotation's `begin` field to reflect that
  // annotation's updated location after `insertion_content` was inserted into
  // the target file.
  size_t pos = 0;
  insertion_offset += indent_length;
  for (const auto& source_annotation : info_to_insert_.annotation()) {
    GeneratedCodeInfo::Annotation* annotation = target_info.add_annotation();
    int inner_indent = 0;
    // insertion_content is guaranteed to end in an endline. This last endline
    // has no effect on indentation.
    for (; pos < source_annotation.end() && pos < insertion_content.size() - 1;
         ++pos) {
      if (insertion_content[pos] == '\n') {
        if (pos >= source_annotation.begin()) {
          // The beginning of the annotation is at insertion_offset, but the end
          // can still move further in the target file.
          inner_indent += indent_length;
        } else {
          insertion_offset += indent_length;
        }
      }
    }
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + insertion_offset);
    insertion_offset += inner_indent;
    annotation->set_end(annotation->end() + insertion_offset);
  }
}